

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

void get_range(int ndim,int *dims,int *lo,int *hi)

{
  int iVar1;
  int iVar2;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  int in_EDI;
  int toss2;
  int toss1;
  int dim;
  undefined4 local_24;
  
  for (local_24 = 0; local_24 < in_EDI; local_24 = local_24 + 1) {
    iVar1 = rand();
    iVar1 = iVar1 % *(int *)(in_RSI + (long)local_24 * 4);
    iVar2 = rand();
    iVar2 = iVar2 % *(int *)(in_RSI + (long)local_24 * 4);
    if (iVar1 < iVar2) {
      *(int *)(in_RDX + (long)local_24 * 4) = iVar1;
      *(int *)(in_RCX + (long)local_24 * 4) = iVar2;
    }
    else {
      *(int *)(in_RCX + (long)local_24 * 4) = iVar1;
      *(int *)(in_RDX + (long)local_24 * 4) = iVar2;
    }
  }
  return;
}

Assistant:

void get_range( int ndim, int dims[], int lo[], int hi[]) 
{
    int dim;
    for(dim=0; dim <ndim;dim++){
        int toss1, toss2;
        toss1 = rand()%dims[dim];
        toss2 = rand()%dims[dim];
        if(toss1<toss2){
            lo[dim]=toss1;
            hi[dim]=toss2;
        }else {
              hi[dim]=toss1;
            lo[dim]=toss2;
        }
    }
}